

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_device_memory_device.cpp
# Opt level: O2

void device_cleanup(void)

{
  embree::TutorialData_Destructor((TutorialData *)&embree::data);
  return;
}

Assistant:

void device_cleanup ()
{
  TutorialData_Destructor(&data);
}